

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::piece_finished_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,piece_finished_alert *this)

{
  char ret [200];
  string local_108;
  char local_e8 [208];
  
  torrent_alert::message_abi_cxx11_(&local_108,&this->super_torrent_alert);
  snprintf(local_e8,200,"%s piece: %d finished downloading",local_108._M_dataplus._M_p,
           (ulong)(uint)(this->piece_index).m_val);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string piece_finished_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "%s piece: %d finished downloading"
			, torrent_alert::message().c_str(), static_cast<int>(piece_index));
		return ret;
	}